

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionModelDiscrete.cpp
# Opt level: O1

Index __thiscall
TransitionModelDiscrete::SampleSuccessorState
          (TransitionModelDiscrete *this,Index state,Index action)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = rand();
  if (0 < this->_m_nrStates) {
    dVar4 = 0.0;
    uVar3 = 0;
    do {
      dVar5 = dVar4;
      (*(this->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel
        [4])(this,state,(ulong)action,uVar3);
      dVar4 = dVar4 + dVar5;
      if ((double)iVar1 * 4.656612873077393e-10 <= dVar4) {
        return (Index)uVar3;
      }
      uVar2 = (Index)uVar3 + 1;
      uVar3 = (ulong)uVar2;
    } while ((int)uVar2 < this->_m_nrStates);
  }
  return 0;
}

Assistant:

Index TransitionModelDiscrete::SampleSuccessorState(Index state, Index action)
{
    double randNr=rand() / (RAND_MAX + 1.0);

    double sum=0;
    Index sucState=0;
    int i;

    for(i=0;i<_m_nrStates;i++)
    {
        sum+=Get(state,action,i);
        if(randNr<=sum)
        {
            sucState=i;
            break;
        }
    }
    return(sucState);
}